

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwshandshake.hpp
# Opt level: O2

void WebSocketHandshakeKeyGen::base64(uchar *src,char *dst)

{
  ulong uVar1;
  char *pcVar2;
  
  pcVar2 = dst + 3;
  for (uVar1 = 0; uVar1 < 0x12; uVar1 = uVar1 + 3) {
    pcVar2[-3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[src[uVar1] >> 2]
    ;
    pcVar2[-2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(uint)(src[uVar1 + 1] >> 4) | (src[uVar1] & 3) << 4];
    pcVar2[-1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(uint)(src[uVar1 + 2] >> 6) + (src[uVar1 + 1] & 0xf) * 4];
    *pcVar2 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
              [src[uVar1 + 2] & 0x3f];
    pcVar2 = pcVar2 + 4;
  }
  pcVar2[-3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[src[0x12] >> 2];
  pcVar2[-2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(uint)(src[0x13] >> 4) | (src[0x12] & 3) << 4];
  pcVar2[-1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(ulong)(src[0x13] & 0xf) * 4];
  *pcVar2 = '=';
  return;
}

Assistant:

static inline void base64(unsigned char *src, char *dst) {
        const char *b64 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
        for (int i = 0; i < 18; i += 3) {
            *dst++ = b64[(src[i] >> 2) & 63];
            *dst++ = b64[((src[i] & 3) << 4) | ((src[i + 1] & 240) >> 4)];
            *dst++ = b64[((src[i + 1] & 15) << 2) | ((src[i + 2] & 192) >> 6)];
            *dst++ = b64[src[i + 2] & 63];
        }
        *dst++ = b64[(src[18] >> 2) & 63];
        *dst++ = b64[((src[18] & 3) << 4) | ((src[19] & 240) >> 4)];
        *dst++ = b64[((src[19] & 15) << 2)];
        *dst++ = '=';
    }